

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadProcessGroup.h
# Opt level: O3

void __thiscall
IlmThread_3_4::ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true>::~ProcessGroup
          (ProcessGroup<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_true> *this)

{
  __pointer_type pbVar1;
  pointer pcVar2;
  
  pbVar1 = (this->_first_failure)._M_b._M_p;
  if (pbVar1 != (__pointer_type)0x0) {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar1->field_2) {
      operator_delete(pcVar2,(pbVar1->field_2)._M_allocated_capacity + 1);
    }
  }
  operator_delete(pbVar1,0x20);
  std::
  vector<Imf_3_4::(anonymous_namespace)::ScanLineProcess,_std::allocator<Imf_3_4::(anonymous_namespace)::ScanLineProcess>_>
  ::~vector(&this->_fixed_pool);
  IlmThread_3_4::Semaphore::~Semaphore(&this->_sem);
  return;
}

Assistant:

~ProcessGroup()
    {
        std::string *cur = _first_failure.load ();
        delete cur;
    }